

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O1

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ConvertNodeToPolicyAndAddToSolution
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,BGIP_BnB_NodePtr *node,
          double value)

{
  int *piVar1;
  element_type *peVar2;
  sp_counted_base *psVar3;
  Index IVar4;
  long lVar5;
  ostream *poVar6;
  undefined8 uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  shared_ptr<JointPolicyPureVector> jpol;
  long *local_68;
  shared_count local_60;
  element_type *local_58;
  shared_count asStack_50 [2];
  shared_ptr<JointPolicyDiscretePure> local_40;
  
  (**(code **)(*(long *)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                         super_BGIP_IncrementalSolverInterface + 0x38))(&local_40,this);
  boost::dynamic_pointer_cast<JointPolicyPureVector,JointPolicyDiscretePure>
            ((boost *)&local_68,&local_40);
  boost::detail::shared_count::~shared_count(&local_40.pn);
  if (this->_m_nrAgents != 0) {
    uVar10 = 0;
    do {
      peVar2 = (this->_m_bgip).px;
      lVar5 = *(long *)(peVar2 + 0x98);
      if ((ulong)(*(long *)(peVar2 + 0xa0) - lVar5 >> 3) <= uVar10) {
LAB_00128ebb:
        uVar7 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar10);
        boost::detail::shared_count::~shared_count(&local_60);
        _Unwind_Resume(uVar7);
      }
      uVar8 = 0;
      while( true ) {
        uVar9 = (ulong)uVar8;
        if (*(ulong *)(lVar5 + uVar10 * 8) == uVar9) break;
        psVar3 = (node->pn).pi_;
        local_58 = node->px;
        asStack_50[0].pi_ = (node->pn).pi_;
        if (psVar3 != (sp_counted_base *)0x0) {
          LOCK();
          piVar1 = &psVar3->use_count_;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        IVar4 = *(Index *)(*(long *)&(this->_m_depthFirstSpecified).
                                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data + uVar9 * 4);
        boost::detail::shared_count::~shared_count(asStack_50);
        IVar4 = BGIP_BnB_Node::GetSpecifiedAction(node->px,(Index)uVar10,IVar4);
        (**(code **)(*local_68 + 0x80))(local_68,uVar10,uVar9,IVar4);
        uVar8 = uVar8 + 1;
        peVar2 = (this->_m_bgip).px;
        lVar5 = *(long *)(peVar2 + 0x98);
        if ((ulong)(*(long *)(peVar2 + 0xa0) - lVar5 >> 3) <= uVar10) goto LAB_00128ebb;
      }
      uVar10 = (ulong)((Index)uVar10 + 1);
    } while (this->_m_nrAgents != uVar10);
  }
  BGIPSolution::AddSolution
            ((JointPolicyPureVector *)
             &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
              super_BGIP_IncrementalSolverInterface.field_0x18,value);
  if (0 < this->_m_verbosity) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"BGIP_SolverBranchAndBound added solution ",0x29);
    std::ostream::_M_insert<void_const*>(&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," with value ",0xc);
    poVar6 = std::ostream::_M_insert<double>(value);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  boost::detail::shared_count::~shared_count(&local_60);
  return;
}

Assistant:

void ConvertNodeToPolicyAndAddToSolution(BGIP_BnB_NodePtr node, double value)
    {
        boost::shared_ptr<JP> jpol =  boost::dynamic_pointer_cast<JP>( this->GetNewJpol() );
        for(Index agI=0;agI!=_m_nrAgents;++agI)
            for(Index tI=0;tI!=_m_bgip->GetNrTypes(agI);++tI)
            {
                Index acI;
#if MAINTAIN_FULL_POL        
                acI = node->GetAction(agI,tI);
#else
#if 0 //CACHE_IMPLIED_JPOL
          // NO, this is not correct, because
          //_m_impliedJPol is not related to the particular node we are
          //computing this for
                acI = _m_impliedJPol[agI][tI];
#else          
                Index depth_tI = GetDepthFirstSpecified(agI,tI,node);
                acI = node->GetSpecifiedAction(agI, depth_tI);
#endif
#endif
                jpol->SetAction(agI,tI,acI);
            }
        this->
            AddSolution(*jpol, value);
        if(_m_verbosity>=1)
            std::cout << "BGIP_SolverBranchAndBound added solution " << jpol
                      << " with value " << value << std::endl;
    }